

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location)

{
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  LocationRecorder *local_28;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  local_28 = service_location;
  service_location_local = (LocationRecorder *)service;
  service_local = (ServiceDescriptorProto *)this;
  bVar1 = ConsumeEndOfDeclaration(this,"{",service_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = AtEnd(this);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Reached end of input in service definition (missing \'}\')."
                   ,&local_49);
        AddError(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator(&local_49);
        return false;
      }
      bVar1 = ParseServiceStatement(this,(ServiceDescriptorProto *)service_location_local,local_28);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}